

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  StringRef *this_00;
  ulong uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t Index;
  char *Str;
  StringRef Suffix;
  StringRef RHS;
  StringRef local_38;
  
  uVar1 = (this->Path).Length;
  if (uVar1 <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Path.cpp"
                  ,0xc4,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  this_00 = &this->Component;
  uVar7 = (this->Component).Length;
  uVar6 = this->Position + uVar7;
  this->Position = uVar6;
  if (uVar6 == uVar1) {
    this_00->Data = (char *)0x0;
    (this->Component).Length = 0;
    return this;
  }
  if (uVar7 < 3) {
LAB_00dbd709:
    bVar4 = false;
  }
  else {
    cVar2 = StringRef::operator[](this_00,0);
    if (cVar2 == '/') {
LAB_00dbd6d6:
      cVar2 = StringRef::operator[](this_00,1);
      bVar4 = false;
      cVar3 = StringRef::operator[](this_00,0);
      if (cVar2 == cVar3) {
        cVar2 = StringRef::operator[](this_00,2);
        if (cVar2 == '/') goto LAB_00dbd709;
        bVar4 = cVar2 != '\\' || this->S != windows;
      }
    }
    else {
      bVar4 = false;
      if ((cVar2 == '\\') && (bVar4 = false, this->S == windows)) goto LAB_00dbd6d6;
    }
  }
  cVar2 = StringRef::operator[](&this->Path,this->Position);
  if (cVar2 == '/') {
    if (bVar4) goto LAB_00dbd757;
    if (this->S == windows) goto LAB_00dbd741;
  }
  else {
    if (cVar2 != '\\' || this->S != windows) goto LAB_00dbd7fb;
    if (bVar4) goto LAB_00dbd757;
LAB_00dbd741:
    Suffix.Length = 1;
    Suffix.Data = ":";
    bVar4 = StringRef::endswith(this_00,Suffix);
    if (bVar4) {
LAB_00dbd757:
      uVar1 = (this->Path).Length;
      uVar7 = this->Position;
      uVar6 = uVar7;
      if (uVar1 < uVar7) {
        uVar6 = uVar1;
      }
      (this->Component).Data = (this->Path).Data + uVar6;
      (this->Component).Length = (ulong)(uVar7 < uVar1);
      return this;
    }
  }
  Index = this->Position;
  while (Index != (this->Path).Length) {
    cVar2 = StringRef::operator[](&this->Path,Index);
    if ((cVar2 != '/') && ((cVar2 != '\\' || (this->S != windows)))) {
      if (this->Position != (this->Path).Length) goto LAB_00dbd7fb;
      break;
    }
    Index = this->Position + 1;
    this->Position = Index;
  }
  RHS.Length = 1;
  RHS.Data = "/";
  bVar4 = llvm::operator!=(this->Component,RHS);
  if (bVar4) {
    this->Position = this->Position - 1;
    (this->Component).Data = ".";
    (this->Component).Length = 1;
    return this;
  }
LAB_00dbd7fb:
  Str = "/";
  if (this->S == windows) {
    Str = "\\/";
  }
  StringRef::StringRef(&local_38,Str);
  sVar5 = StringRef::find_first_of(&this->Path,local_38,this->Position);
  uVar1 = (this->Path).Length;
  uVar7 = this->Position;
  if (uVar1 < this->Position) {
    uVar7 = uVar1;
  }
  uVar6 = sVar5;
  if (sVar5 < uVar7) {
    uVar6 = uVar7;
  }
  if (uVar1 < sVar5) {
    uVar6 = uVar1;
  }
  (this->Component).Data = (this->Path).Data + uVar7;
  (this->Component).Length = uVar6 - uVar7;
  return this;
}

Assistant:

const_iterator &const_iterator::operator++() {
  assert(Position < Path.size() && "Tried to increment past end!");

  // Increment Position to past the current component
  Position += Component.size();

  // Check for end.
  if (Position == Path.size()) {
    Component = StringRef();
    return *this;
  }

  // Both POSIX and Windows treat paths that begin with exactly two separators
  // specially.
  bool was_net = Component.size() > 2 && is_separator(Component[0], S) &&
                 Component[1] == Component[0] && !is_separator(Component[2], S);

  // Handle separators.
  if (is_separator(Path[Position], S)) {
    // Root dir.
    if (was_net ||
        // c:/
        (real_style(S) == Style::windows && Component.endswith(":"))) {
      Component = Path.substr(Position, 1);
      return *this;
    }

    // Skip extra separators.
    while (Position != Path.size() && is_separator(Path[Position], S)) {
      ++Position;
    }

    // Treat trailing '/' as a '.', unless it is the root dir.
    if (Position == Path.size() && Component != "/") {
      --Position;
      Component = ".";
      return *this;
    }
  }

  // Find next component.
  size_t end_pos = Path.find_first_of(separators(S), Position);
  Component = Path.slice(Position, end_pos);

  return *this;
}